

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *t_00;
  Table *events;
  Value *pVVar1;
  StkId pTVar2;
  bool bVar3;
  TValue *pTVar4;
  Value *unaff_RBP;
  TValue *o2_1;
  TValue *o2_4;
  TValue *o2_2;
  int iVar5;
  TValue *o1;
  TValue *o2;
  TValue *o2_3;
  TValue temp;
  Value local_40;
  int local_38;
  
  iVar5 = 100;
  do {
    if (((Value *)((long)t + 8))->b == 5) {
      t_00 = *(GCObject **)t;
      pTVar4 = luaH_set(L,&t_00->h,key);
      if (pTVar4->tt == 0) {
        events = (t_00->h).metatable;
        if ((events == (Table *)0x0) || ((events->flags & 2) != 0)) {
          unaff_RBP = (Value *)0x0;
        }
        else {
          unaff_RBP = &luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1])->value;
        }
        bVar3 = true;
        if (unaff_RBP == (Value *)0x0) {
          unaff_RBP = (Value *)0x0;
          goto LAB_0010fea9;
        }
      }
      else {
LAB_0010fea9:
        pTVar4->value = val->value;
        pTVar4->tt = val->tt;
        (t_00->h).flags = '\0';
        if (((3 < val->tt) && (((((val->value).gc)->gch).marked & 3) != 0)) &&
           (((t_00->gch).marked & 4) != 0)) {
          luaC_barrierback(L,&t_00->h);
        }
        bVar3 = false;
      }
      if (bVar3) goto LAB_0010ff58;
      bVar3 = false;
    }
    else {
      unaff_RBP = &luaT_gettmbyobj(L,t,TM_NEWINDEX)->value;
      if (unaff_RBP[1].b == 0) {
        luaG_typeerror(L,t,"index");
      }
LAB_0010ff58:
      if (unaff_RBP[1].b == 6) {
        pVVar1 = &L->top->value;
        *pVVar1 = *unaff_RBP;
        pVVar1[1].b = unaff_RBP[1].b;
        pTVar2 = L->top;
        pTVar2[1].value = t->value;
        pTVar2[1].tt = ((Value *)((long)t + 8))->b;
        pTVar2 = L->top;
        pTVar2[2].value = key->value;
        pTVar2[2].tt = key->tt;
        pTVar2 = L->top;
        pTVar2[3].value = val->value;
        pTVar2[3].tt = val->tt;
        if ((long)L->stack_last - (long)L->top < 0x41) {
          luaD_growstack(L,4);
        }
        pTVar2 = L->top;
        L->top = pTVar2 + 4;
        bVar3 = false;
        luaD_call(L,pTVar2,0);
      }
      else {
        local_40 = *unaff_RBP;
        local_38 = unaff_RBP[1].b;
        bVar3 = true;
        t = (TValue *)&local_40;
      }
    }
    if (!bVar3) {
      return;
    }
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      luaG_runerror(L,"loop in settable");
      return;
    }
  } while( true );
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  int loop;
  TValue temp;
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;
    if (ttistable(t)) {  /* `t' is a table? */
      Table *h = hvalue(t);
      TValue *oldval = luaH_set(L, h, key); /* do a primitive set */
      if (!ttisnil(oldval) ||  /* result is no nil? */
          (tm = fasttm(L, h->metatable, TM_NEWINDEX)) == NULL) { /* or no TM? */
        setobj2t(L, oldval, val);
        h->flags = 0;
        luaC_barriert(L, h, val);
        return;
      }
      /* else will try the tag method */
    }
    else if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
      luaG_typeerror(L, t, "index");
    if (ttisfunction(tm)) {
      callTM(L, tm, t, key, val);
      return;
    }
    /* else repeat with `tm' */
    setobj(L, &temp, tm);  /* avoid pointing inside table (may rehash) */
    t = &temp;
  }
  luaG_runerror(L, "loop in settable");
}